

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O1

int argon2_verify_ctx(argon2_context *context,char *hash,argon2_type type)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = argon2_ctx_mem(context,type,(void *)0x0,0);
  if (iVar2 == 0) {
    iVar2 = 0;
    if ((ulong)context->outlen != 0) {
      bVar1 = 0;
      uVar3 = 0;
      do {
        bVar1 = bVar1 | context->out[uVar3] ^ hash[uVar3];
        uVar3 = uVar3 + 1;
      } while (context->outlen != uVar3);
      iVar2 = -0x23;
      if ((bVar1 - 1 >> 8 & 1) != 0) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int argon2_verify_ctx(argon2_context *context, const char *hash,
                      argon2_type type) {
    int ret = argon2_ctx(context, type);
    if (ret != ARGON2_OK) {
        return ret;
    }

    if (argon2_compare((uint8_t *)hash, context->out, context->outlen)) {
        return ARGON2_VERIFY_MISMATCH;
    }

    return ARGON2_OK;
}